

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O2

bool __thiscall
axl::io::MappedFile::setup(MappedFile *this,size_t maxDynamicViewCount,size_t readAheadSize)

{
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_28;
  
  if (maxDynamicViewCount == 0) {
    err::ErrorRef::ErrorRef((ErrorRef *)&BStack_28,0x16);
    err::setError((ErrorRef *)&BStack_28);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&BStack_28);
  }
  else {
    this->m_maxDynamicViewCount = maxDynamicViewCount;
    this->m_readAheadSize = readAheadSize;
    MappedViewMgr::limitViewCount(&this->m_dynamicViewMgr,maxDynamicViewCount);
  }
  return maxDynamicViewCount != 0;
}

Assistant:

bool
MappedFile::setup(
	size_t maxDynamicViewCount,
	size_t readAheadSize
) {
	if (!maxDynamicViewCount)
		return err::fail(err::SystemErrorCode_InvalidParameter);

	m_maxDynamicViewCount = maxDynamicViewCount;
	m_readAheadSize = readAheadSize;

	m_dynamicViewMgr.limitViewCount(maxDynamicViewCount);
	return true;
}